

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O1

void __thiscall
Annotations::Add(Annotations *this,int side,double x,double y,char *net,char *part,char *pin,
                char *note)

{
  int iVar1;
  char *zErrMsg;
  char sql [10240];
  
  zErrMsg = (char *)0x0;
  sqlite3_snprintf(0x2800,sql,
                   "INSERT into annotations ( visible, side, posx, posy, net, part, pin, note ) \t\t\tvalues ( 1, %d, %0.0f, %0.0f, \'%s\', \'%s\', \'%s\', \'%q\' );"
                   ,side,net,part,pin,note);
  iVar1 = sqlite3_exec(this->sqldb,sql,0,0,&zErrMsg);
  if (iVar1 == 0) {
    if (this->debug != false) {
      fwrite("Records created successfully\n",0x1d,1,_stdout);
    }
  }
  else {
    if (this->debug != false) {
      Add((Annotations *)&zErrMsg);
    }
    sqlite3_free(zErrMsg);
  }
  return;
}

Assistant:

void Annotations::Add(int side, double x, double y, const char *net, const char *part, const char *pin, const char *note) {
	char sql[10240];
	char *zErrMsg = 0;
	int r;

	sqlite3_snprintf(sizeof(sql),
	                 sql,
	                 "INSERT into annotations ( visible, side, posx, posy, net, part, pin, note ) \
			values ( 1, %d, %0.0f, %0.0f, '%s', '%s', '%s', '%q' );",
	                 side,
	                 x,
	                 y,
	                 net,
	                 part,
	                 pin,
	                 note);

	r = sqlite3_exec(sqldb, sql, NULL, 0, &zErrMsg);
	if (r != SQLITE_OK) {
		if (debug) fprintf(stderr, "SQL error: %s\n", zErrMsg);
		sqlite3_free(zErrMsg);
	} else {
		if (debug) fprintf(stdout, "Records created successfully\n");
	}
}